

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O0

bool __thiscall
Js::InlineCache::PretendTryGetProperty
          (InlineCache *this,Type *type,PropertyCacheOperationInfo *operationInfo)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PropertyCacheOperationInfo *operationInfo_local;
  Type *type_local;
  InlineCache *this_local;
  
  if (type == (this->u).local.type) {
    operationInfo->cacheType = CacheType_Local;
    operationInfo->slotType = SlotType_Inline;
    this_local._7_1_ = true;
  }
  else if ((Type *)((ulong)type | 4) == (this->u).local.type) {
    operationInfo->cacheType = CacheType_Local;
    operationInfo->slotType = SlotType_Aux;
    this_local._7_1_ = true;
  }
  else if (type == (this->u).local.typeWithoutProperty) {
    operationInfo->cacheType = CacheType_Proto;
    operationInfo->slotType = SlotType_Inline;
    this_local._7_1_ = true;
  }
  else if ((Type *)((ulong)type | 4) == (this->u).local.typeWithoutProperty) {
    operationInfo->cacheType = CacheType_Proto;
    operationInfo->slotType = SlotType_Aux;
    this_local._7_1_ = true;
  }
  else if (type == (Type *)(this->u).proto.prototypeObject) {
    if (((this->u).accessor.field_1.rawUInt16 >> 1 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                  ,0xee,"(u.accessor.flags & InlineCacheGetterFlag)",
                                  "u.accessor.flags & InlineCacheGetterFlag");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    operationInfo->cacheType = CacheType_Getter;
    operationInfo->slotType = SlotType_Inline;
    this_local._7_1_ = true;
  }
  else if ((DynamicObject *)((ulong)type | 4) == (this->u).proto.prototypeObject) {
    if (((this->u).accessor.field_1.rawUInt16 >> 1 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                  ,0xf7,"(u.accessor.flags & InlineCacheGetterFlag)",
                                  "u.accessor.flags & InlineCacheGetterFlag");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    operationInfo->cacheType = CacheType_Getter;
    operationInfo->slotType = SlotType_Aux;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool InlineCache::PretendTryGetProperty(Type *const type, PropertyCacheOperationInfo * operationInfo) const
    {
        if (type == u.local.type)
        {
            operationInfo->cacheType = CacheType_Local;
            operationInfo->slotType = SlotType_Inline;
            return true;
        }

        if (TypeWithAuxSlotTag(type) == u.local.type)
        {
            operationInfo->cacheType = CacheType_Local;
            operationInfo->slotType = SlotType_Aux;
            return true;
        }

        if (type == u.proto.type)
        {
            operationInfo->cacheType = CacheType_Proto;
            operationInfo->slotType = SlotType_Inline;
            return true;
        }

        if (TypeWithAuxSlotTag(type) == u.proto.type)
        {
            operationInfo->cacheType = CacheType_Proto;
            operationInfo->slotType = SlotType_Aux;
            return true;
        }

        if (type == u.accessor.type)
        {
            Assert(u.accessor.flags & InlineCacheGetterFlag);

            operationInfo->cacheType = CacheType_Getter;
            operationInfo->slotType = SlotType_Inline;
            return true;
        }

        if (TypeWithAuxSlotTag(type) == u.accessor.type)
        {
            Assert(u.accessor.flags & InlineCacheGetterFlag);

            operationInfo->cacheType = CacheType_Getter;
            operationInfo->slotType = SlotType_Aux;
            return true;
        }

        return false;
    }